

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int jsonLabelCompareEscaped(char *zLeft,u32 nLeft,int rawLeft,char *zRight,u32 nRight,int rawRight)

{
  int iVar1;
  u32 uVar2;
  byte *in_RCX;
  int in_EDX;
  uint in_ESI;
  byte *in_RDI;
  uint in_R8D;
  int in_R9D;
  long in_FS_OFFSET;
  u32 n_1;
  int sz_1;
  u32 n;
  int sz;
  u32 cRight;
  u32 cLeft;
  byte *local_20;
  int local_14;
  u32 local_10;
  u32 local_c;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_c = 0xaaaaaaaa;
  local_10 = 0xaaaaaaaa;
  local_20 = in_RDI;
  while( true ) {
    if (in_ESI == 0) {
      local_c = 0;
    }
    else if ((in_EDX == 0) && (*local_20 == 0x5c)) {
      uVar2 = jsonUnescapeOneChar((char *)((ulong)in_ESI << 0x20),(u32)((ulong)in_RCX >> 0x20),
                                  (u32 *)CONCAT44(in_R8D,in_R9D));
      local_20 = local_20 + uVar2;
      in_ESI = in_ESI - uVar2;
    }
    else {
      local_c = (u32)*local_20;
      if (local_c < 0xc0) {
        local_20 = local_20 + 1;
        in_ESI = in_ESI - 1;
      }
      else {
        iVar1 = sqlite3Utf8ReadLimited(local_20,in_ESI,&local_c);
        local_20 = local_20 + iVar1;
        in_ESI = in_ESI - iVar1;
      }
    }
    if (in_R8D == 0) {
      local_10 = 0;
    }
    else if ((in_R9D == 0) && (*in_RCX == 0x5c)) {
      uVar2 = jsonUnescapeOneChar((char *)CONCAT44(in_ESI,in_EDX),(u32)((ulong)in_RCX >> 0x20),
                                  (u32 *)((ulong)in_R8D << 0x20));
      in_RCX = in_RCX + uVar2;
      in_R8D = in_R8D - uVar2;
    }
    else {
      local_10 = (u32)*in_RCX;
      if (local_10 < 0xc0) {
        in_RCX = in_RCX + 1;
        in_R8D = in_R8D - 1;
      }
      else {
        iVar1 = sqlite3Utf8ReadLimited(in_RCX,in_R8D,&local_10);
        in_RCX = in_RCX + iVar1;
        in_R8D = in_R8D - iVar1;
      }
    }
    if (local_c != local_10) break;
    if (local_c == 0) {
      local_14 = 1;
LAB_00235754:
      if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
        __stack_chk_fail();
      }
      return local_14;
    }
  }
  local_14 = 0;
  goto LAB_00235754;
}

Assistant:

static SQLITE_NOINLINE int jsonLabelCompareEscaped(
  const char *zLeft,          /* The left label */
  u32 nLeft,                  /* Size of the left label in bytes */
  int rawLeft,                /* True if zLeft contains no escapes */
  const char *zRight,         /* The right label */
  u32 nRight,                 /* Size of the right label in bytes */
  int rawRight                /* True if zRight is escape-free */
){
  u32 cLeft, cRight;
  assert( rawLeft==0 || rawRight==0 );
  while( 1 /*exit-by-return*/ ){
    if( nLeft==0 ){
      cLeft = 0;
    }else if( rawLeft || zLeft[0]!='\\' ){
      cLeft = ((u8*)zLeft)[0];
      if( cLeft>=0xc0 ){
        int sz = sqlite3Utf8ReadLimited((u8*)zLeft, nLeft, &cLeft);
        zLeft += sz;
        nLeft -= sz;
      }else{
        zLeft++;
        nLeft--;
      }
    }else{
      u32 n = jsonUnescapeOneChar(zLeft, nLeft, &cLeft);
      zLeft += n;
      assert( n<=nLeft );
      nLeft -= n;
    }
    if( nRight==0 ){
      cRight = 0;
    }else if( rawRight || zRight[0]!='\\' ){
      cRight = ((u8*)zRight)[0];
      if( cRight>=0xc0 ){
        int sz = sqlite3Utf8ReadLimited((u8*)zRight, nRight, &cRight);
        zRight += sz;
        nRight -= sz;
      }else{
        zRight++;
        nRight--;
      }
    }else{
      u32 n = jsonUnescapeOneChar(zRight, nRight, &cRight);
      zRight += n;
      assert( n<=nRight );
      nRight -= n;
    }
    if( cLeft!=cRight ) return 0;
    if( cLeft==0 ) return 1;
  }
}